

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bninchr(bstring b0,int pos,bstring b1)

{
  int iVar1;
  uchar *puVar2;
  int i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar8;
  bool bVar9;
  charField chrs;
  charField local_60;
  ulong uVar7;
  
  if ((b0 != (bstring)0x0 && -1 < pos) && (puVar2 = b0->data, puVar2 != (uchar *)0x0)) {
    uVar5 = (ulong)(uint)pos;
    iVar1 = b0->slen;
    if ((pos < iVar1) && (iVar3 = buildCharField(&local_60,b1), -1 < iVar3)) {
      lVar4 = 0;
      do {
        local_60.content[lVar4] = ~local_60.content[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      pbVar8 = puVar2 + uVar5;
      uVar7 = uVar5;
      do {
        bVar9 = ((uint)local_60.content[*pbVar8 >> 5] >> (*pbVar8 & 0x1f) & 1) != 0;
        if (bVar9) {
          uVar5 = uVar7;
        }
        if (bVar9) {
          return (int)uVar5;
        }
        uVar6 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar6;
        pbVar8 = pbVar8 + 1;
      } while ((int)uVar6 < iVar1);
    }
  }
  return -1;
}

Assistant:

int bninchr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL || 
	    b0->slen <= pos) return BSTR_ERR;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	invertCharField (&chrs);
	return binchrCF (b0->data, b0->slen, pos, &chrs);
}